

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (Mat *a,float b,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m128 _b;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_mul op;
  Mat *m;
  __m256 *in_stack_fffffffffffffb80;
  __m256 *in_stack_fffffffffffffb88;
  binary_op_mul *in_stack_fffffffffffffb90;
  __m512 *in_stack_fffffffffffffba0;
  __m512 *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  float local_420 [2];
  float afStack_418 [2];
  float local_410 [4];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_32c;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_310;
  long local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined8 local_2e8;
  float *local_2e0;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  binary_op_mul local_2c9 [13];
  float local_2bc;
  long *local_2b8;
  undefined8 *local_2b0;
  undefined1 local_2a5;
  int local_2a4;
  undefined8 *local_298;
  undefined8 *local_288;
  undefined1 local_280 [64];
  float local_20c;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  float *local_198;
  float local_18c;
  float *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float *local_158;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_13c;
  float *local_138;
  float local_130 [2];
  float afStack_128 [2];
  float *local_120;
  long local_118;
  undefined4 local_10c;
  long local_108;
  float *local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined8 *local_b8;
  undefined1 local_a0 [32];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  
  local_2d0 = (int)in_RDI[7];
  local_2d4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_2bc = in_XMM0_Da;
  local_2b8 = in_RDI;
  for (local_2d8 = 0; local_2d8 < local_2d0; local_2d8 = local_2d8 + 1) {
    local_298 = &local_328;
    local_ec = *(int *)((long)local_2b8 + 0x2c);
    local_f0 = (int)local_2b8[6];
    local_f4 = *(undefined4 *)((long)local_2b8 + 0x34);
    local_2e0 = (float *)(*local_2b8 + local_2b8[8] * (long)local_2d8 * local_2b8[2]);
    local_108 = local_2b8[2];
    local_10c = (undefined4)local_2b8[3];
    local_118 = local_2b8[4];
    local_e8 = &local_328;
    local_d8 = (long)local_ec * (long)local_f0 * local_108;
    local_288 = &local_328;
    local_2b0 = &local_328;
    local_dc = 0x10;
    local_2a4 = local_2d8;
    local_2a5 = 1;
    local_328 = 0;
    local_318 = 0;
    local_310 = 0;
    local_300 = 0;
    local_2fc = 0;
    local_2f8 = 0;
    local_2f4 = 0;
    local_2f0 = 0;
    local_2e8 = 0;
    local_320 = 0;
    local_32c = 0;
    local_20c = local_2bc;
    local_280 = vbroadcastss_avx512f(ZEXT416((uint)local_2bc));
    local_380 = local_280._0_8_;
    uStack_378 = local_280._8_8_;
    uStack_370 = local_280._16_8_;
    uStack_368 = local_280._24_8_;
    uStack_360 = local_280._32_8_;
    uStack_358 = local_280._40_8_;
    uStack_350 = local_280._48_8_;
    uStack_348 = local_280._56_8_;
    local_100 = local_2e0;
    local_b8 = local_2b0;
    local_308 = local_118;
    for (; local_32c + 0xf < local_2d4; local_32c = local_32c + 0x10) {
      local_208 = local_2e0;
      uVar6 = *(undefined8 *)local_2e0;
      uVar5 = *(undefined8 *)(local_2e0 + 2);
      uVar7 = *(undefined8 *)(local_2e0 + 4);
      uVar8 = *(undefined8 *)(local_2e0 + 6);
      uVar9 = *(undefined8 *)(local_2e0 + 8);
      uVar10 = *(undefined8 *)(local_2e0 + 10);
      uVar11 = *(undefined8 *)(local_2e0 + 0xc);
      uVar12 = *(undefined8 *)(local_2e0 + 0xe);
      local_3c0 = uVar6;
      uStack_3b8 = uVar5;
      uStack_3b0 = uVar7;
      uStack_3a8 = uVar8;
      uStack_3a0 = uVar9;
      uStack_398 = uVar10;
      uStack_390 = uVar11;
      uStack_388 = uVar12;
      BinaryOp_x86_avx512_functor::binary_op_mul::func_pack16
                ((binary_op_mul *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      local_198 = local_2e0;
      *(undefined8 *)local_2e0 = uVar6;
      *(undefined8 *)(local_2e0 + 2) = uVar5;
      *(undefined8 *)(local_2e0 + 4) = uVar7;
      *(undefined8 *)(local_2e0 + 6) = uVar8;
      *(undefined8 *)(local_2e0 + 8) = uVar9;
      *(undefined8 *)(local_2e0 + 10) = uVar10;
      *(undefined8 *)(local_2e0 + 0xc) = uVar11;
      *(undefined8 *)(local_2e0 + 0xe) = uVar12;
      local_2e0 = local_2e0 + 0x10;
      local_3c0 = uVar6;
      uStack_3b8 = uVar5;
      uStack_3b0 = uVar7;
      uStack_3a8 = uVar8;
      uStack_3a0 = uVar9;
      uStack_398 = uVar10;
      uStack_390 = uVar11;
      uStack_388 = uVar12;
      local_200 = uVar6;
      uStack_1f8 = uVar5;
      uStack_1f0 = uVar7;
      uStack_1e8 = uVar8;
      uStack_1e0 = uVar9;
      uStack_1d8 = uVar10;
      uStack_1d0 = uVar11;
      uStack_1c8 = uVar12;
    }
    local_18c = local_2bc;
    local_54 = local_2bc;
    local_58 = local_2bc;
    local_5c = local_2bc;
    local_60 = local_2bc;
    local_64 = local_2bc;
    local_68 = local_2bc;
    local_6c = local_2bc;
    local_70 = local_2bc;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_2bc),ZEXT416((uint)local_2bc),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2bc),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_2bc),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_2bc),ZEXT416((uint)local_2bc),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2bc),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2bc),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_a0._0_8_ = auVar2._0_8_;
    local_a0._8_8_ = auVar2._8_8_;
    local_a0._16_8_ = auVar1._0_8_;
    local_a0._24_8_ = auVar1._8_8_;
    local_3e0 = local_a0._0_8_;
    uStack_3d8 = local_a0._8_8_;
    uStack_3d0 = local_a0._16_8_;
    uStack_3c8 = local_a0._24_8_;
    in_stack_fffffffffffffbb4 = local_2bc;
    local_a0 = auVar4;
    for (; local_32c + 7 < local_2d4; local_32c = local_32c + 8) {
      local_188 = local_2e0;
      uVar6 = *(undefined8 *)local_2e0;
      uVar5 = *(undefined8 *)(local_2e0 + 2);
      uVar7 = *(undefined8 *)(local_2e0 + 4);
      uVar8 = *(undefined8 *)(local_2e0 + 6);
      local_400 = uVar6;
      uStack_3f8 = uVar5;
      uStack_3f0 = uVar7;
      uStack_3e8 = uVar8;
      BinaryOp_x86_avx512_functor::binary_op_mul::func_pack8
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      local_158 = local_2e0;
      *(undefined8 *)local_2e0 = uVar6;
      *(undefined8 *)(local_2e0 + 2) = uVar5;
      *(undefined8 *)(local_2e0 + 4) = uVar7;
      *(undefined8 *)(local_2e0 + 6) = uVar8;
      local_2e0 = local_2e0 + 8;
      local_400 = uVar6;
      uStack_3f8 = uVar5;
      uStack_3f0 = uVar7;
      uStack_3e8 = uVar8;
      local_180 = uVar6;
      uStack_178 = uVar5;
      uStack_170 = uVar7;
      uStack_168 = uVar8;
    }
    local_13c = local_2bc;
    local_150 = local_2bc;
    fStack_14c = local_2bc;
    fStack_148 = local_2bc;
    fStack_144 = local_2bc;
    for (; local_32c + 3 < local_2d4; local_32c = local_32c + 4) {
      local_138 = local_2e0;
      local_420 = *(float (*) [2])local_2e0;
      uVar6 = *(undefined8 *)(local_2e0 + 2);
      afStack_418 = (float  [2])uVar6;
      afVar13 = BinaryOp_x86_avx512_functor::binary_op_mul::func_pack4
                          (local_2c9,(__m128 *)local_420,&local_410);
      local_420 = afVar13._0_8_;
      local_120 = local_2e0;
      *(float (*) [2])local_2e0 = local_420;
      *(undefined8 *)(local_2e0 + 2) = uVar6;
      local_2e0 = local_2e0 + 4;
      afStack_418 = (float  [2])uVar6;
      local_130 = local_420;
      afStack_128 = (float  [2])uVar6;
    }
    for (; local_32c < local_2d4; local_32c = local_32c + 1) {
      fVar3 = BinaryOp_x86_avx512_functor::binary_op_mul::func(local_2c9,local_2e0,&local_2bc);
      *local_2e0 = fVar3;
      local_2e0 = local_2e0 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps((float)b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr, b);
            ptr++;
        }
    }

    return 0;
}